

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_rb_acquire_write(ma_rb *pRB,size_t *pSizeInBytes,void **ppBufferOut)

{
  void *pvVar1;
  uint uVar2;
  ulong uVar3;
  void *__s;
  ma_result mVar4;
  
  mVar4 = MA_INVALID_ARGS;
  if (ppBufferOut != (void **)0x0 && (pSizeInBytes != (size_t *)0x0 && pRB != (ma_rb *)0x0)) {
    if ((int)(pRB->encodedWriteOffset ^ pRB->encodedReadOffset) < 0) {
      uVar2 = pRB->encodedReadOffset & 0x7fffffff;
    }
    else {
      uVar2 = pRB->subbufferSizeInBytes;
    }
    uVar3 = (ulong)(uVar2 - (pRB->encodedWriteOffset & 0x7fffffff));
    if (*pSizeInBytes < uVar3) {
      uVar3 = *pSizeInBytes;
    }
    *pSizeInBytes = uVar3;
    pvVar1 = pRB->pBuffer;
    __s = (void *)((ulong)(pRB->encodedWriteOffset & 0x7fffffff) + (long)pvVar1);
    *ppBufferOut = __s;
    mVar4 = MA_SUCCESS;
    if ((pRB->clearOnWriteAcquire != '\0') &&
       (mVar4 = MA_SUCCESS, *pSizeInBytes != 0 && pvVar1 != (void *)0x0)) {
      mVar4 = MA_SUCCESS;
      memset(__s,0,*pSizeInBytes);
    }
  }
  return mVar4;
}

Assistant:

MA_API ma_result ma_rb_acquire_write(ma_rb* pRB, size_t* pSizeInBytes, void** ppBufferOut)
{
    ma_uint32 readOffset;
    ma_uint32 readOffsetInBytes;
    ma_uint32 readOffsetLoopFlag;
    ma_uint32 writeOffset;
    ma_uint32 writeOffsetInBytes;
    ma_uint32 writeOffsetLoopFlag;
    size_t bytesAvailable;
    size_t bytesRequested;

    if (pRB == NULL || pSizeInBytes == NULL || ppBufferOut == NULL) {
        return MA_INVALID_ARGS;
    }

    /* The returned buffer should never overtake the read buffer. */
    readOffset = ma_atomic_load_32(&pRB->encodedReadOffset);
    ma_rb__deconstruct_offset(readOffset, &readOffsetInBytes, &readOffsetLoopFlag);

    writeOffset = ma_atomic_load_32(&pRB->encodedWriteOffset);
    ma_rb__deconstruct_offset(writeOffset, &writeOffsetInBytes, &writeOffsetLoopFlag);

    /*
    In the case of writing, if the write pointer and the read pointer are on the same loop iteration we can only
    write up to the end of the buffer. Otherwise we can only write up to the read pointer. The write pointer should
    never overtake the read pointer.
    */
    if (writeOffsetLoopFlag == readOffsetLoopFlag) {
        bytesAvailable = pRB->subbufferSizeInBytes - writeOffsetInBytes;
    } else {
        bytesAvailable = readOffsetInBytes - writeOffsetInBytes;
    }

    bytesRequested = *pSizeInBytes;
    if (bytesRequested > bytesAvailable) {
        bytesRequested = bytesAvailable;
    }

    *pSizeInBytes = bytesRequested;
    *ppBufferOut  = ma_rb__get_write_ptr(pRB);

    /* Clear the buffer if desired. */
    if (pRB->clearOnWriteAcquire) {
        MA_ZERO_MEMORY(*ppBufferOut, *pSizeInBytes);
    }

    return MA_SUCCESS;
}